

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.cpp
# Opt level: O2

void __thiscall lan::db::erase_bit(db *this,db_bit *bit)

{
  db_bit *pdVar1;
  
  if (bit != (db_bit *)0x0) {
    if (bit->pre == (db_bit *)0x0) {
      if (bit->con != (db_bit *)0x0) {
        bit->con->lin = bit->nex;
      }
    }
    else {
      bit->pre->nex = bit->nex;
    }
    pdVar1 = this->first;
    if (pdVar1 == bit) {
      pdVar1 = pdVar1->nex;
    }
    this->first = pdVar1;
    pdVar1 = this->last;
    if (pdVar1 == bit) {
      pdVar1 = pdVar1->pre;
    }
    this->last = pdVar1;
    if (bit->lin != (db_bits *)0x0) {
      erase_bits(this,bit->lin);
    }
    db_bit::~db_bit(bit);
    operator_delete(bit,0x50);
    return;
  }
  return;
}

Assistant:

void db::erase_bit(db_bit * bit){
            if(bit){
                if(bit->pre)
                    bit->pre->nex = bit->nex;
                else if(bit->con)
                    bit->con->lin = bit->nex;
                first = (bit == first) ? first->nex : first ;
                last = (bit == last) ? last->pre : last;
                if(bit->lin)
                    erase_bits(bit->lin);
                delete bit;
                bit = nullptr;
            }
        }